

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

String * Rct::shortOptions(String *__return_storage_ptr__,option *longOptions)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int i;
  option *longOptions_local;
  String *ret;
  
  String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  local_20 = 0;
  do {
    if (longOptions[local_20].name == (char *)0x0) {
      return __return_storage_ptr__;
    }
    if (longOptions[local_20].val != 0) {
      bVar2 = String::contains(__return_storage_ptr__,(char)longOptions[local_20].val,CaseSensitive)
      ;
      if (bVar2) {
        printf("%c (%s) is already used\n",(ulong)(uint)longOptions[local_20].val,
               longOptions[local_20].name);
        bVar2 = String::contains(__return_storage_ptr__,(char)longOptions[local_20].val,
                                 CaseSensitive);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!ret.contains(longOptions[i].val)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                        ,0x9a,"String Rct::shortOptions(const option *)");
        }
      }
      String::append(__return_storage_ptr__,(char)longOptions[local_20].val);
      iVar1 = longOptions[local_20].has_arg;
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          String::append(__return_storage_ptr__,':');
        }
        else {
          if (iVar1 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                          ,0xa7,"String Rct::shortOptions(const option *)");
          }
          String::append(__return_storage_ptr__,"::",0xffffffffffffffff);
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

String shortOptions(const option *longOptions)
{
    String ret;
    for (int i=0; longOptions[i].name; ++i) {
        if (longOptions[i].val) {
            if (ret.contains(longOptions[i].val)) {
                printf("%c (%s) is already used\n", longOptions[i].val, longOptions[i].name);
                assert(!ret.contains(longOptions[i].val));
            }
            ret.append(longOptions[i].val);
            switch (longOptions[i].has_arg) {
            case no_argument:
                break;
            case optional_argument:
                ret.append("::");
                break;
            case required_argument:
                ret.append(':');
                break;
            default:
                assert(0);
                break;
            }
        }
    }
#if 0
    String unused;
    for (char ch='a'; ch<='z'; ++ch) {
        if (!ret.contains(ch)) {
            unused.append(ch);
        }
        const char upper = toupper(ch);
        if (!ret.contains(upper)) {
            unused.append(upper);
        }
    }
    printf("Unused letters: %s\n", unused.nullTerminated());
#endif
    return ret;
}